

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  char *pcVar3;
  undefined8 *puVar4;
  anon_union_24_2_13149d16_for_String_2 *paVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  String *pSVar13;
  IReporter **curr_rep;
  undefined8 *puVar14;
  anon_union_24_2_13149d16_for_String_2 *__s2;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  anon_union_24_2_13149d16_for_String_2 local_80;
  anon_union_24_2_13149d16_for_String_2 local_68;
  anon_union_24_2_13149d16_for_String_2 local_50;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as != true) {
        (this->super_AssertData).m_failed = true;
        goto LAB_0010dcb9;
      }
LAB_0010de9a:
      pcVar3 = (this->super_AssertData).m_exception_string;
      sVar10 = strlen(pcVar3);
      String::String((String *)&local_80.data,pcVar3,(uint)sVar10);
      paVar5 = (anon_union_24_2_13149d16_for_String_2 *)CONCAT44(local_80._4_4_,local_80._0_4_);
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar13 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar13 = &(this->super_AssertData).m_exception;
      }
      bVar7 = local_80.buf[0x17] < '\0';
      __s2 = &local_80;
      if (bVar7) {
        __s2 = paVar5;
      }
      iVar8 = strcmp((char *)pSVar13,__s2->buf);
      __x = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
      (this->super_AssertData).m_failed = iVar8 != 0;
      if (paVar5 != (anon_union_24_2_13149d16_for_String_2 *)0x0 && bVar7) {
        operator_delete__(paVar5);
        __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
      }
      goto LAB_0010dcb9;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar6 = (this->super_AssertData).m_threw_as;
      goto LAB_0010dcb4;
    }
    if ((EVar2 & is_throws_with) != 0) goto LAB_0010de9a;
    if (-1 < (char)EVar2) goto LAB_0010dcb9;
    bVar6 = (this->super_AssertData).m_threw;
  }
  else {
    bVar6 = (this->super_AssertData).m_threw;
LAB_0010dcb4:
    bVar6 = bVar6 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar6;
LAB_0010dcb9:
  bVar6 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar6 < '\0') {
    uVar11 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar11 = 0x17 - (bVar6 & 0x1f);
  }
  if (uVar11 != 0) {
    pSVar13 = &(this->super_AssertData).m_exception;
    String::String((String *)&local_38.data,"\"",1);
    operator+((String *)&local_50.data,(String *)&local_38.data,pSVar13);
    String::String((String *)&local_68.data,"\"",1);
    operator+((String *)&local_80.data,(String *)&local_50.data,(String *)&local_68.data);
    if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
       (pcVar3 = (pSVar13->field_0).data.ptr, pcVar3 != (char *)0x0)) {
      operator_delete__(pcVar3);
    }
    *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
         CONCAT17(local_80.buf[0x17],local_80._16_7_);
    *(undefined4 *)&pSVar13->field_0 = local_80._0_4_;
    *(undefined4 *)((long)&(this->super_AssertData).m_exception.field_0 + 4) = local_80._4_4_;
    (this->super_AssertData).m_exception.field_0.data.size = local_80.data.size;
    (this->super_AssertData).m_exception.field_0.data.capacity = local_80.data.capacity;
    if ((local_68.buf[0x17] < '\0') && (local_68.data.ptr != (char *)0x0)) {
      operator_delete__(local_68.data.ptr);
      local_80._0_4_ = extraout_XMM0_Da;
      local_80._4_4_ = extraout_XMM0_Db;
    }
    if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
      operator_delete__(local_50.data.ptr);
      local_80._0_4_ = extraout_XMM0_Da_00;
      local_80._4_4_ = extraout_XMM0_Db_00;
    }
    __x = (double)CONCAT44(local_80._4_4_,local_80._0_4_);
    if ((local_38.buf[0x17] < '\0') &&
       (__x = (double)CONCAT44(local_80._4_4_,local_80._0_4_), local_38.data.ptr != (char *)0x0)) {
      operator_delete__(local_38.data.ptr);
      __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar9 = g_cs + 0xb8;
      if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
        LOCK();
        UNLOCK();
        uVar12 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x18) = uVar12;
        *(undefined1 *)(in_FS_OFFSET + -0x10) = 1;
      }
      else {
        uVar12 = *(ulong *)(in_FS_OFFSET + -0x18);
      }
      LOCK();
      piVar1 = (int *)(lVar9 + uVar12 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar4 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar14 = *(undefined8 **)(g_cs + 0x10d0); puVar14 != puVar4; puVar14 = puVar14 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar14 + 0x48))((long *)*puVar14,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar9 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -0x10) == '\0') {
        LOCK();
        UNLOCK();
        uVar12 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(in_FS_OFFSET + -0x18) = uVar12;
        *(undefined1 *)(in_FS_OFFSET + -0x10) = 1;
      }
      else {
        uVar12 = *(ulong *)(in_FS_OFFSET + -0x18);
      }
      LOCK();
      piVar1 = (int *)(lVar9 + uVar12 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar7 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    if (bVar7) {
      __x = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }